

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

expression_list * __thiscall
mjs::parser::parse_argument_list(expression_list *__return_storage_ptr__,parser *this)

{
  undefined4 uVar1;
  char *__addr_len;
  pointer *__ptr;
  undefined1 local_98 [80];
  token local_48;
  
  __addr_len = "parse_argument_list";
  expect(&local_48,this,lparen,"parse_argument_list",0x27b);
  token::destroy(&local_48);
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  accept((parser *)local_98,(int)this,(sockaddr *)0x2f,(socklen_t *)__addr_len);
  uVar1 = local_98._0_4_;
  token::destroy((token *)local_98);
  if (uVar1 == eof) {
    do {
      parse_assignment_expression((parser *)local_98);
      std::
      vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>
      ::emplace_back<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                ((vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_98);
      if ((long *)CONCAT44(local_98._4_4_,local_98._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_98._4_4_,local_98._0_4_) + 8))();
      }
      accept((parser *)local_98,(int)this,(sockaddr *)0x20,(socklen_t *)__addr_len);
      uVar1 = local_98._0_4_;
      token::destroy((token *)local_98);
    } while (uVar1 != eof);
    expect((token *)(local_98 + 0x28),this,rparen,"parse_argument_list",0x281);
    token::destroy((token *)(local_98 + 0x28));
  }
  return __return_storage_ptr__;
}

Assistant:

expression_list parse_argument_list() {
        EXPECT(token_type::lparen);
        expression_list l;
        if (!accept(token_type::rparen)) {
            do {
                l.push_back(parse_assignment_expression());
            } while (accept(token_type::comma));
            EXPECT(token_type::rparen);
        }
        return l;
    }